

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O0

void __thiscall
websocketpp::http::parser::request::process(request *this,iterator begin,iterator end)

{
  bool bVar1;
  exception *peVar2;
  allocator<char> local_201;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  string local_1f0;
  allocator<char> local_1c9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  string local_1b8;
  undefined1 local_191;
  string local_190;
  string local_170;
  allocator<char> local_149;
  string local_148;
  char local_121;
  request *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  allocator<char> local_f9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  string local_e8;
  undefined1 local_c1;
  string local_c0;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  char local_41;
  char *local_40;
  char *local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  iterator cursor_end;
  iterator cursor_start;
  request *this_local;
  iterator end_local;
  iterator begin_local;
  
  local_41 = ' ';
  local_40 = end._M_current;
  local_38 = begin._M_current;
  cursor_end = begin;
  this_local = (request *)end._M_current;
  end_local = begin;
  local_30 = std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                       (begin._M_current,end._M_current,&local_41);
  bVar1 = __gnu_cxx::operator==
                    (&local_30,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this_local);
  if (bVar1) {
    local_c1 = 1;
    peVar2 = (exception *)__cxa_allocate_exception(0x70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Invalid request line1",&local_69);
    std::__cxx11::string::string((string *)&local_a0);
    std::__cxx11::string::string((string *)&local_c0);
    exception::exception(peVar2,&local_68,bad_request,&local_a0,&local_c0);
    local_c1 = 0;
    __cxa_throw(peVar2,&exception::typeinfo,exception::~exception);
  }
  local_f0._M_current = cursor_end._M_current;
  local_f8._M_current = local_30._M_current;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)&local_e8,local_f0,local_f8,&local_f9);
  set_method(this,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_f9);
  local_118 = (char *)__gnu_cxx::
                      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator+(&local_30,1);
  local_120 = this_local;
  local_121 = ' ';
  local_108 = local_118;
  cursor_end._M_current = local_118;
  local_110 = (char *)std::find<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )local_118,
                                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )this_local,&local_121);
  local_30 = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_110;
  bVar1 = __gnu_cxx::operator==
                    (&local_30,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&this_local);
  if (!bVar1) {
    local_1c0._M_current = cursor_end._M_current;
    local_1c8._M_current = local_30._M_current;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)&local_1b8,local_1c0,local_1c8,&local_1c9);
    set_uri(this,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1c9);
    local_1f8 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator+(&local_30,1);
    local_200._M_current = (char *)this_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)&local_1f0,local_1f8,local_200,&local_201);
    parser::set_version(&this->super_parser,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator(&local_201);
    return;
  }
  local_191 = 1;
  peVar2 = (exception *)__cxa_allocate_exception(0x70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"Invalid request line2",&local_149);
  std::__cxx11::string::string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_190);
  exception::exception(peVar2,&local_148,bad_request,&local_170,&local_190);
  local_191 = 0;
  __cxa_throw(peVar2,&exception::typeinfo,exception::~exception);
}

Assistant:

inline void request::process(std::string::iterator begin, std::string::iterator
    end)
{
    std::string::iterator cursor_start = begin;
    std::string::iterator cursor_end = std::find(begin,end,' ');

    if (cursor_end == end) {
        throw exception("Invalid request line1",status_code::bad_request);
    }

    set_method(std::string(cursor_start,cursor_end));

    cursor_start = cursor_end+1;
    cursor_end = std::find(cursor_start,end,' ');

    if (cursor_end == end) {
        throw exception("Invalid request line2",status_code::bad_request);
    }

    set_uri(std::string(cursor_start,cursor_end));
    set_version(std::string(cursor_end+1,end));
}